

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Type __thiscall capnp::Schema::BrandArgumentList::operator[](BrandArgumentList *this,uint index)

{
  ushort uVar1;
  BrandParameter param;
  BrandParameter param_00;
  Type local_b8;
  Type local_a8;
  Type local_98;
  uint local_84;
  Type local_80;
  Scope *local_70;
  uint local_68;
  Type local_60;
  undefined1 local_50 [8];
  Type result;
  Binding *binding;
  uint index_local;
  BrandArgumentList *this_local;
  
  if ((this->isUnbound & 1U) == 0) {
    if (index < this->size_) {
      result.field_4.schema = (RawBrandedSchema *)(this->bindings + index);
      capnp::Type::Type((Type *)local_50);
      if (*(char *)&(result.field_4.schema)->generic == '\x12') {
        if ((result.field_4.schema)->scopes == (Scope *)0x0) {
          if (((ulong)(result.field_4.schema)->generic & 0x100) == 0) {
            capnp::Type::Type(&local_98,*(Which *)((long)&(result.field_4.schema)->generic + 4));
            local_50._0_2_ = local_98.baseType;
            local_50[2] = local_98.listDepth;
            local_50[3] = local_98.isImplicitParam;
            local_50._4_2_ = local_98.field_3;
            local_50._6_2_ = local_98._6_2_;
            result._0_8_ = local_98.field_4;
          }
          else {
            local_84._2_2_ = 0;
            local_84._0_2_ = *(ushort *)((long)&(result.field_4.schema)->generic + 4);
            capnp::Type::Type(&local_80,(ImplicitParameter)local_84);
            local_50._0_2_ = local_80.baseType;
            local_50[2] = local_80.listDepth;
            local_50[3] = local_80.isImplicitParam;
            local_50._4_2_ = local_80.field_3;
            local_50._6_2_ = local_80._6_2_;
            result._0_8_ = local_80.field_4;
          }
        }
        else {
          local_70 = (result.field_4.schema)->scopes;
          uVar1 = *(ushort *)((long)&(result.field_4.schema)->generic + 4);
          local_68 = (uint)uVar1;
          param_00.index._0_2_ = uVar1;
          param_00.scopeId = (uint64_t)local_70;
          param_00._10_6_ = 0;
          capnp::Type::Type(&local_60,param_00);
          local_50._0_2_ = local_60.baseType;
          local_50[2] = local_60.listDepth;
          local_50[3] = local_60.isImplicitParam;
          local_50._4_2_ = local_60.field_3;
          local_50._6_2_ = local_60._6_2_;
          result._0_8_ = local_60.field_4;
        }
      }
      else if ((result.field_4.schema)->scopes == (Scope *)0x0) {
        capnp::Type::Type(&local_a8,(ushort)*(byte *)&(result.field_4.schema)->generic);
        local_50._0_2_ = local_a8.baseType;
        local_50[2] = local_a8.listDepth;
        local_50[3] = local_a8.isImplicitParam;
        local_50._4_2_ = local_a8.field_3;
        local_50._6_2_ = local_a8._6_2_;
        result._0_8_ = local_a8.field_4;
      }
      else {
        capnp::_::RawBrandedSchema::ensureInitialized
                  ((RawBrandedSchema *)(result.field_4.schema)->scopes);
        capnp::Type::Type(&local_b8,(ushort)*(byte *)&(result.field_4.schema)->generic,
                          (RawBrandedSchema *)(result.field_4.schema)->scopes);
        local_50._0_2_ = local_b8.baseType;
        local_50[2] = local_b8.listDepth;
        local_50[3] = local_b8.isImplicitParam;
        local_50._4_2_ = local_b8.field_3;
        local_50._6_2_ = local_b8._6_2_;
        result._0_8_ = local_b8.field_4;
      }
      _this_local = capnp::Type::wrapInList
                              ((Type *)local_50,
                               (uint)*(ushort *)((long)&(result.field_4.schema)->generic + 2));
    }
    else {
      capnp::Type::Type((Type *)&this_local,ANY_POINTER);
    }
  }
  else {
    param.index = index;
    param.scopeId = this->scopeId;
    param._12_4_ = 0;
    capnp::Type::Type((Type *)&this_local,param);
  }
  return _this_local;
}

Assistant:

Type Schema::BrandArgumentList::operator[](uint index) const {
  if (isUnbound) {
    return Type::BrandParameter { scopeId, index };
  }

  if (index >= size_) {
    // Binding index out-of-range. Treat as AnyPointer. This is important to allow new
    // type parameters to be added to existing types without breaking dependent
    // schemas.
    return schema::Type::ANY_POINTER;
  }

  auto& binding = bindings[index];
  Type result;
  if (binding.which == (uint)schema::Type::ANY_POINTER) {
    if (binding.scopeId != 0) {
      result = Type::BrandParameter { binding.scopeId, binding.paramIndex };
    } else if (binding.isImplicitParameter) {
      result = Type::ImplicitParameter { binding.paramIndex };
    } else {
      result = static_cast<schema::Type::AnyPointer::Unconstrained::Which>(binding.paramIndex);
    }
  } else if (binding.schema == nullptr) {
    // Builtin / primitive type.
    result = static_cast<schema::Type::Which>(binding.which);
  } else {
    binding.schema->ensureInitialized();
    result = Type(static_cast<schema::Type::Which>(binding.which), binding.schema);
  }

  return result.wrapInList(binding.listDepth);
}